

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O3

bool __thiscall
dxil_spv::CFGNode::dominates_all_reachable_exits
          (CFGNode *this,UnorderedSet<const_CFGNode_*> *completed,CFGNode *header)

{
  CFGNode *pCVar1;
  pointer ppCVar2;
  const_iterator cVar3;
  CFGNode *pCVar4;
  pointer ppCVar5;
  __hashtable *__h;
  bool bVar6;
  bool bVar7;
  __node_gen_type __node_gen;
  CFGNode *local_30;
  CFGNode *local_28;
  
  local_30 = this;
  cVar3 = std::
          _Hashtable<const_dxil_spv::CFGNode_*,_const_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<const_dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<const_dxil_spv::CFGNode_*>,_std::hash<const_dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&completed->_M_h,&local_30);
  bVar7 = true;
  if (cVar3.super__Node_iterator_base<const_dxil_spv::CFGNode_*,_false>._M_cur == (__node_type *)0x0
     ) {
    local_30 = (CFGNode *)completed;
    local_28 = this;
    std::
    _Hashtable<dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>,std::__detail::_Identity,std::equal_to<dxil_spv::CFGNode_const*>,std::hash<dxil_spv::CFGNode_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<dxil_spv::CFGNode_const*,std::__detail::_AllocNode<dxil_spv::ThreadLocalAllocator<std::__detail::_Hash_node<dxil_spv::CFGNode_const*,false>>>>
              ((_Hashtable<dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>,std::__detail::_Identity,std::equal_to<dxil_spv::CFGNode_const*>,std::hash<dxil_spv::CFGNode_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)completed);
    if (this->succ_back_edge == (CFGNode *)0x0) {
LAB_0014a23b:
      ppCVar2 = (this->succ).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      bVar7 = true;
      for (ppCVar5 = (this->succ).
                     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppCVar5 != ppCVar2;
          ppCVar5 = ppCVar5 + 1) {
        pCVar4 = *ppCVar5;
        while (pCVar4 != header) {
          pCVar1 = pCVar4->immediate_dominator;
          if (pCVar1 == (CFGNode *)0x0) {
            return false;
          }
          bVar7 = pCVar4 == pCVar1;
          pCVar4 = pCVar1;
          if (bVar7) {
            return false;
          }
        }
        bVar7 = dominates_all_reachable_exits(*ppCVar5,completed,header);
        if (!bVar7) {
          return bVar7;
        }
      }
    }
    else {
      bVar7 = false;
      pCVar4 = this->succ_back_edge;
      do {
        if (pCVar4 == header) goto LAB_0014a23b;
        pCVar1 = pCVar4->immediate_dominator;
      } while ((pCVar1 != (CFGNode *)0x0) && (bVar6 = pCVar4 != pCVar1, pCVar4 = pCVar1, bVar6));
    }
  }
  return bVar7;
}

Assistant:

bool CFGNode::dominates_all_reachable_exits(UnorderedSet<const CFGNode *> &completed, const CFGNode &header) const
{
	if (!completed.count(this))
	{
		completed.insert(this);
		if (succ_back_edge && !header.dominates(succ_back_edge))
			return false;

		for (auto *node : succ)
			if (!header.dominates(node) || !node->dominates_all_reachable_exits(completed, header))
				return false;
	}

	return true;
}